

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordered_set_partition_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Ordered_set_partition_iterator::increment
          (Ordered_set_partition_iterator *this)

{
  type_conflict tVar1;
  Permutation_iterator *lhs;
  Set_partition_iterator *lhs_00;
  Ordered_set_partition_iterator *this_local;
  
  lhs = boost::iterators::detail::
        iterator_facade_base<Gudhi::coxeter_triangulation::Permutation_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
        ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Permutation_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                      *)&(this->value_).p_it_);
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<Gudhi::coxeter_triangulation::Permutation_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long>
                      *)lhs,(iterator_facade<Gudhi::coxeter_triangulation::Permutation_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long>
                             *)&this->p_end_);
  if (tVar1) {
    lhs_00 = boost::iterators::detail::
             iterator_facade_base<Gudhi::coxeter_triangulation::Set_partition_iterator,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&,_long,_false,_false>
             ::operator++((iterator_facade_base<Gudhi::coxeter_triangulation::Set_partition_iterator,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&,_long,_false,_false>
                           *)&this->value_);
    tVar1 = boost::iterators::operator==
                      ((iterator_facade<Gudhi::coxeter_triangulation::Set_partition_iterator,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&,_long>
                        *)lhs_00,
                       (iterator_facade<Gudhi::coxeter_triangulation::Set_partition_iterator,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&,_long>
                        *)this);
    if (tVar1) {
      this->is_end_ = true;
    }
    else {
      Permutation_iterator::reinitialize(&(this->value_).p_it_);
    }
  }
  return;
}

Assistant:

void increment() {
    if (++value_.p_it_ == p_end_) {
      if (++value_.s_it_ == s_end_) {
        is_end_ = true;
        return;
      } else
        value_.p_it_.reinitialize();
    }
  }